

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O1

uint64_t snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::dev_urandom(void)

{
  bool bVar1;
  int __fd;
  uint64_t in_RAX;
  ssize_t sVar2;
  int *piVar3;
  long lVar4;
  anon_union_8_2_fa62e37e anon_var_0;
  uint64_t local_18;
  
  local_18 = in_RAX;
  __fd = open("/dev/urandom",0x80000,0);
  if (0 < __fd) {
    lVar4 = 0;
    do {
      if (lVar4 == 8) {
LAB_001068f4:
        bVar1 = false;
      }
      else {
        sVar2 = read(__fd,(void *)((long)&local_18 + lVar4),8 - lVar4);
        if (sVar2 < 1) {
          piVar3 = __errno_location();
          if ((*piVar3 != 4) && (*piVar3 != 0xb)) goto LAB_001068f4;
        }
        else {
          lVar4 = lVar4 + sVar2;
        }
        bVar1 = true;
      }
    } while (bVar1);
    close(__fd);
    if (lVar4 == 8) {
      return local_18;
    }
  }
  error("Failed to get system randomness");
}

Assistant:

static uint64_t dev_urandom()
    {
      union
      {
        uint64_t result;
        char buffer[sizeof(uint64_t)];
      };

      ssize_t ret;
      int flags = O_RDONLY;
#if defined(O_CLOEXEC)
      flags |= O_CLOEXEC;
#endif
      auto fd = open("/dev/urandom", flags, 0);
      if (fd > 0)
      {
        auto current = stl::begin(buffer);
        auto target = stl::end(buffer);
        while (auto length = static_cast<size_t>(target - current))
        {
          ret = read(fd, current, length);
          if (ret <= 0)
          {
            if (errno != EAGAIN && errno != EINTR)
            {
              break;
            }
          }
          else
          {
            current += ret;
          }
        }
        ret = close(fd);
        SNMALLOC_ASSERT(0 == ret);
        if (SNMALLOC_LIKELY(target == current))
        {
          return result;
        }
      }

      error("Failed to get system randomness");
    }